

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTestShared.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::NegativeTestShared::NegativeTestContext::beginSection
          (NegativeTestContext *this,string *desc)

{
  TestLog *this_00;
  string local_88;
  LogSection local_68;
  
  if ((this->super_CallLogWrapper).m_enableLog == true) {
    this_00 = (this->super_CallLogWrapper).m_log;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"callstream","");
    tcu::LogSection::LogSection(&local_68,&local_88,desc);
    tcu::TestLog::startSection
              (this_00,local_68.m_name._M_dataplus._M_p,local_68.m_description._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.m_description._M_dataplus._M_p != &local_68.m_description.field_2) {
      operator_delete(local_68.m_description._M_dataplus._M_p,
                      local_68.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.m_name._M_dataplus._M_p != &local_68.m_name.field_2) {
      operator_delete(local_68.m_name._M_dataplus._M_p,
                      local_68.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    this->m_openSections = this->m_openSections + 1;
  }
  return;
}

Assistant:

void NegativeTestContext::beginSection (const string& desc)
{
	if (isLoggingEnabled())
	{
		getLog() << TestLog::Section("callstream", desc);
		m_openSections++;
	}
}